

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O1

basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpath::detail::
lt_operator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(lt_operator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,const_reference lhs,const_reference rhs,error_code *param_3)

{
  bool bVar1;
  int iVar2;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *other;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> bVar4;
  
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(rhs);
  if (bVar1) {
    bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                      ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       param_3);
    if (!bVar1) goto LAB_0041de7e;
LAB_0041de96:
    iVar2 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                      (rhs,(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           param_3);
    *(undefined2 *)
     &(this->
      super_binary_operator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      )._vptr_binary_operator = 1;
    uVar3 = extraout_RDX;
    if (iVar2 < 0) {
      *(undefined1 *)
       ((long)&(this->
               super_binary_operator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               )._vptr_binary_operator + 2) = 1;
    }
    else {
      *(undefined1 *)
       ((long)&(this->
               super_binary_operator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               )._vptr_binary_operator + 2) = 0;
    }
  }
  else {
LAB_0041de7e:
    bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(rhs);
    if (bVar1) {
      bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         param_3);
      if (bVar1) goto LAB_0041de96;
    }
    other = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,other);
    uVar3 = extraout_RDX_00;
  }
  bVar4.field_0.int64_.val_ = uVar3;
  bVar4.field_0._0_8_ = this;
  return (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar4.field_0;
}

Assistant:

Json evaluate(const_reference lhs, const_reference rhs, std::error_code&) const override 
        {
            if (lhs.is_number() && rhs.is_number())
            {
                return lhs < rhs ? Json(true, semantic_tag::none) : Json(false, semantic_tag::none);
            }
            if (lhs.is_string() && rhs.is_string())
            {
                return lhs < rhs ? Json(true, semantic_tag::none) : Json(false, semantic_tag::none);
            }
            return Json::null();
        }